

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O0

void __thiscall astar::AStar::MigratePoint(AStar *this,PointCost *pc,Point *start,Point *end)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined1 local_98 [24];
  int cost;
  priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
  local_78;
  _Node_iterator_base<std::pair<const_unsigned_int,_int>,_false> local_58;
  key_type local_4c;
  _Node_iterator_base<std::pair<const_unsigned_int,_int>,_false> local_48;
  Point local_3c;
  Point local_34;
  Point tmp;
  int i;
  Point *end_local;
  Point *start_local;
  PointCost *pc_local;
  AStar *this_local;
  
  unique0x1000021d = end;
  for (tmp.x = 0; tmp.x < (int)this->moveType; tmp.x = tmp.x + 1) {
    Point::Point(&local_3c,MigratePoint::move[tmp.x][0],MigratePoint::move[tmp.x][1]);
    local_34 = operator+(&pc->point,&local_3c);
    bVar2 = PointVaild(this,&local_34);
    if (bVar2) {
      iVar1 = local_34.x;
      iVar4 = local_34.y;
      iVar3 = Map::Width(&this->map);
      local_4c = iVar1 + iVar4 * iVar3;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::find(&this->closeZone,&local_4c);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::end(&this->closeZone);
      bVar2 = std::__detail::operator!=(&local_48,&local_58);
      if (!bVar2) {
        std::
        priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
        ::priority_queue(&local_78,&this->openZone);
        bVar2 = InOpenZone(this,&local_78,&local_34);
        std::
        priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
        ::~priority_queue(&local_78);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          iVar1 = pc->cost;
          iVar4 = MoveCast(this,&pc->point,&local_34,1,1,1);
          local_98._16_4_ = MoveCast(this,&local_34,stack0xffffffffffffffd8,1,1,1);
          local_98._16_4_ = iVar1 + iVar4 + local_98._16_4_;
          std::make_shared<astar::AStar::PointCost,astar::AStar::PointCost_const&>
                    ((PointCost *)local_98);
          std::
          priority_queue<astar::AStar::PointCost,std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>,std::less<astar::AStar::PointCost>>
          ::emplace<astar::Point&,int&,std::shared_ptr<astar::AStar::PointCost>>
                    ((priority_queue<astar::AStar::PointCost,std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>,std::less<astar::AStar::PointCost>>
                      *)&this->openZone,&local_34,(int *)(local_98 + 0x10),
                     (shared_ptr<astar::AStar::PointCost> *)local_98);
          std::shared_ptr<astar::AStar::PointCost>::~shared_ptr
                    ((shared_ptr<astar::AStar::PointCost> *)local_98);
        }
      }
    }
  }
  return;
}

Assistant:

void MigratePoint(const PointCost& pc, const Point& start, const Point& end)
    {
        // up, down, left, right, diagonal up right, diagonal down right, diagonal down left, diagonal up left
        static int move[8][2] = {{0, -1}, {0, 1}, {-1, 0}, {1, 0}, {1, -1}, {1, 1}, {-1, 1}, {-1, -1}};
        for (int i = 0; i < moveType; i++) {
            auto tmp = pc.point + Point(move[i][0], move[i][1]);
            if (PointVaild(tmp)) {
                if (closeZone.find(tmp.x + tmp.y * map.Width()) != closeZone.end()) {
                    continue;
                }
                if (!InOpenZone(openZone, tmp)) {
                    int cost = pc.cost + MoveCast(pc.point, tmp) + MoveCast(tmp, end);
                    openZone.emplace(tmp, cost, std::make_shared<PointCost>(pc));
                }
            }
        }
    }